

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  bool local_49;
  string_view local_30;
  string_view local_20;
  WastLexer *local_10;
  WastLexer *this_local;
  
  local_10 = this;
  string_view::string_view(&local_20,"nan");
  bVar1 = MatchString(this,local_20);
  if (bVar1) {
    bVar1 = MatchChar(this,':');
    if (bVar1) {
      string_view::string_view(&local_30,"0x");
      bVar1 = MatchString(this,local_30);
      local_49 = false;
      if (bVar1) {
        bVar1 = ReadHexNum(this);
        local_49 = false;
        if (bVar1) {
          local_49 = NoTrailingReservedChars(this);
        }
      }
      if (local_49 != false) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
        return __return_storage_ptr__;
      }
    }
    else {
      bVar1 = NoTrailingReservedChars(this);
      if (bVar1) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
        return __return_storage_ptr__;
      }
    }
  }
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}